

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O1

int Hex::Hexdumper<unsigned_char>::count_identical_lines(uchar *first,uchar *last,int unitsperline)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  pair<const_unsigned_char_*,_const_unsigned_char_*> thisline;
  pair<const_unsigned_char_*,_const_unsigned_char_*> firstline;
  pair<const_unsigned_char_*,_const_unsigned_char_*> local_50;
  pair<const_unsigned_char_*,_const_unsigned_char_*> local_40;
  
  local_40.second = first + unitsperline;
  if (last <= first + unitsperline) {
    local_40.second = last;
  }
  iVar2 = 0;
  local_50.first = local_40.second;
  local_40.first = first;
  do {
    if (last <= local_50.first) {
      return iVar2 + 1;
    }
    puVar3 = local_50.first + unitsperline;
    if (last <= local_50.first + unitsperline) {
      puVar3 = last;
    }
    local_50.second = puVar3;
    bVar1 = data_is_equal<std::pair<unsigned_char_const*,unsigned_char_const*>>(&local_40,&local_50)
    ;
    iVar2 = iVar2 + 1;
    local_50.first = puVar3;
  } while (bVar1);
  return iVar2 + (uint)bVar1;
}

Assistant:

static int count_identical_lines(const T*first, const T*last, int unitsperline)
    {
        auto p = first;
        auto pend = std::min(last, p+unitsperline);
        auto firstline = std::make_pair(p, pend);

        int count = 1;

        p = pend;
        while (p<last) {
            auto pend = std::min(last, p+unitsperline);
            auto thisline = std::make_pair(p, pend);

            if (!data_is_equal(firstline, thisline))
                break;

            count++;

            p = pend;
        }

        return count;
    }